

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * bsim::lshr(quad_value_bit_vector *a,quad_value_bit_vector *shift_amount)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  quad_value_bit_vector *this;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i_1;
  int i;
  bv_uint64 shift_int;
  quad_value_bit_vector res;
  undefined4 in_stack_ffffffffffffff88;
  quad_value_bit_vector *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  int local_54;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  quad_value_bit_vector *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffdc;
  
  this_00 = in_RDI;
  bVar1 = quad_value_bit_vector::is_binary(in_RDI);
  if ((bVar1) && (bVar1 = quad_value_bit_vector::is_binary(this_00), bVar1)) {
    quad_value_bit_vector::bitLength(in_RSI);
    quad_value_bit_vector::quad_value_bit_vector
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    this = (quad_value_bit_vector *)get_shift_int(in_RDI);
    if (this == (quad_value_bit_vector *)0x0) {
      quad_value_bit_vector::quad_value_bit_vector
                ((quad_value_bit_vector *)0x0,
                 (quad_value_bit_vector *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      local_54 = quad_value_bit_vector::bitLength(in_RSI);
      while( true ) {
        local_54 = local_54 + -1;
        if (local_54 < (int)this) break;
        iVar2 = local_54 - (int)this;
        quad_value_bit_vector::get
                  ((quad_value_bit_vector *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
        quad_value_bit_vector::set
                  ((quad_value_bit_vector *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0,
                   (quad_value)(uchar)((ulong)in_RDI >> 0x38));
      }
      iVar2 = quad_value_bit_vector::bitLength(in_RSI);
      while( true ) {
        iVar4 = iVar2 + -1;
        iVar2 = iVar4;
        iVar3 = quad_value_bit_vector::bitLength(in_RSI);
        if (iVar4 < iVar3 - (int)this) break;
        quad_value_bit_vector::set
                  ((quad_value_bit_vector *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                   (int)((ulong)this_00 >> 0x20),(int)this_00);
      }
      quad_value_bit_vector::quad_value_bit_vector
                (this,(quad_value_bit_vector *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    quad_value_bit_vector::~quad_value_bit_vector((quad_value_bit_vector *)0x19c225);
  }
  else {
    quad_value_bit_vector::bitLength(in_RSI);
    unknown_bv(in_stack_ffffffffffffffdc);
  }
  return this_00;
}

Assistant:

static inline quad_value_bit_vector
  lshr(const quad_value_bit_vector& a,
       const quad_value_bit_vector& shift_amount) {

    if (!a.is_binary() || !shift_amount.is_binary()) {
      return unknown_bv(a.bitLength());
    }
    
    quad_value_bit_vector res(a.bitLength());

    bv_uint64 shift_int = get_shift_int(shift_amount);

    if (shift_int == 0) {
      return a;
    }

    //unsigned char sign_bit = a.get(a.bitLength() - 1);
    for (int i = a.bitLength() - 1; i >= (int) shift_int; i--) {
      res.set(i - shift_int, a.get(i));
    }

    for (int i = a.bitLength() - 1; i >= (((int) a.bitLength()) - ((int) shift_int)); i--) {
      res.set(i, 0);
    }

    return res;
  }